

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warped_motion.c
# Opt level: O1

int av1_find_projection(int np,int *pts1,int *pts2,BLOCK_SIZE bsize,int mvy,int mvx,
                       WarpedMotionParams *wm_params,int mi_row,int mi_col)

{
  ulong uVar1;
  int iVar2;
  byte bVar3;
  undefined7 in_register_00000009;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar27;
  undefined1 auVar26 [16];
  uint uVar28;
  int iVar29;
  
  uVar19 = CONCAT71(in_register_00000009,bsize) & 0xffffffff;
  iVar2 = (block_size_high[uVar19] >> 1) - 1;
  iVar15 = (block_size_wide[uVar19] >> 1) - 1;
  uVar19 = 0;
  if (np < 1) {
    iVar21 = 0;
    iVar22 = 0;
    iVar23 = 0;
    iVar24 = 0;
    lVar18 = 0;
    lVar14 = 0;
  }
  else {
    iVar21 = 0;
    iVar22 = 0;
    iVar23 = 0;
    iVar24 = 0;
    uVar17 = 0;
    iVar11 = 0;
    iVar7 = 0;
    do {
      iVar25 = (int)*(undefined8 *)(pts2 + uVar17 * 2) - (mvx + iVar15 * 8);
      iVar27 = (int)((ulong)*(undefined8 *)(pts2 + uVar17 * 2) >> 0x20) - (mvy + iVar2 * 8);
      uVar28 = (int)*(undefined8 *)(pts1 + uVar17 * 2) + iVar15 * -8;
      iVar29 = (int)((ulong)*(undefined8 *)(pts1 + uVar17 * 2) >> 0x20) + iVar2 * -8;
      uVar13 = uVar28 - iVar25;
      uVar5 = -uVar13;
      if (0 < (int)uVar13) {
        uVar5 = uVar13;
      }
      if (uVar5 < 0x100) {
        uVar13 = iVar29 - iVar27;
        uVar5 = -uVar13;
        if (0 < (int)uVar13) {
          uVar5 = uVar13;
        }
        if (uVar5 < 0x100) {
          uVar19 = (ulong)(uint)((int)uVar19 + ((int)((uVar28 * 4 + 0x20) * uVar28 + 0x80) >> 4));
          iVar11 = iVar11 + ((int)(uVar28 * 4 * iVar29 + (uVar28 + iVar29) * 0x10 + 0x40) >> 4);
          iVar7 = iVar7 + ((iVar29 * 4 + 0x20) * iVar29 + 0x80 >> 4);
          auVar26._0_4_ = iVar25 * 4;
          auVar26._4_4_ = iVar27 * 4;
          auVar26._8_4_ = auVar26._0_4_;
          auVar26._12_4_ = auVar26._4_4_;
          iVar21 = iVar21 + ((iVar27 + iVar29) * 0x10 + auVar26._4_4_ * iVar29 + 0x80 >> 4);
          iVar22 = iVar22 + ((iVar25 + iVar29) * 0x10 + auVar26._0_4_ * iVar29 + 0x40 >> 4);
          iVar23 = iVar23 + ((int)((iVar27 + uVar28) * 0x10 + auVar26._4_4_ * uVar28 + 0x40) >> 4);
          iVar24 = iVar24 + ((int)((iVar25 + uVar28) * 0x10 +
                                   (int)((auVar26._8_8_ & 0xffffffff) * (ulong)uVar28) + 0x80) >> 4)
          ;
        }
      }
      uVar17 = uVar17 + 1;
    } while ((uint)np != uVar17);
    lVar14 = (long)(int)uVar19;
    uVar19 = (ulong)iVar7;
    lVar18 = (long)iVar11;
  }
  uVar5 = 1;
  uVar17 = lVar14 * uVar19 - lVar18 * lVar18;
  if (uVar17 != 0) {
    uVar12 = -uVar17;
    if (0 < (long)uVar17) {
      uVar12 = uVar17;
    }
    uVar6 = uVar12 >> 0x20;
    uVar1 = uVar6;
    if (uVar6 == 0) {
      uVar1 = uVar12;
    }
    uVar5 = 0x1f;
    if ((uint)uVar1 != 0) {
      for (; (uint)uVar1 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar5 = uVar5 ^ ((uint)(uVar6 != 0) << 5 | 0x1f) ^ 0x1f;
    bVar3 = (byte)uVar5;
    lVar8 = (-1L << (bVar3 & 0x3f)) + uVar12;
    if (uVar5 < 9) {
      lVar8 = lVar8 << (8 - bVar3 & 0x3f);
    }
    else {
      lVar8 = (long)(((ulong)(1L << (bVar3 - 8 & 0x3f)) >> 1) + lVar8) >> (bVar3 - 8 & 0x3f);
    }
    uVar13 = -(uint)div_lut[lVar8];
    if (-1 < (long)uVar17) {
      uVar13 = (uint)div_lut[lVar8];
    }
    bVar4 = bVar3 - 2;
    if (uVar5 < 2) {
      bVar4 = 0;
      uVar13 = uVar13 << (2 - bVar3 & 0x1f);
    }
    lVar16 = (long)(short)uVar13;
    lVar8 = (uVar19 * (long)iVar24 - lVar18 * iVar22) * lVar16;
    lVar9 = (1L << (bVar4 & 0x3f)) >> 1;
    if (lVar8 < 0) {
      lVar8 = -(lVar9 - lVar8 >> (bVar4 & 0x3f));
    }
    else {
      lVar8 = lVar8 + lVar9 >> (bVar4 & 0x3f);
    }
    lVar9 = 0x11fff;
    if (lVar8 < 0x11fff) {
      lVar9 = lVar8;
    }
    lVar8 = 0xe001;
    if (0xe001 < lVar9) {
      lVar8 = lVar9;
    }
    wm_params->wmmat[2] = (int)lVar8;
    lVar9 = (iVar22 * lVar14 + (long)iVar24 * -lVar18) * lVar16;
    lVar10 = (1L << (bVar4 & 0x3f)) >> 1;
    if (lVar9 < 0) {
      lVar9 = -(lVar10 - lVar9 >> (bVar4 & 0x3f));
    }
    else {
      lVar9 = lVar9 + lVar10 >> (bVar4 & 0x3f);
    }
    lVar10 = 0x1fff;
    if (lVar9 < 0x1fff) {
      lVar10 = lVar9;
    }
    lVar9 = -0x1fff;
    if (-0x1fff < lVar10) {
      lVar9 = lVar10;
    }
    wm_params->wmmat[3] = (int)lVar9;
    lVar20 = (uVar19 * (long)iVar23 - lVar18 * iVar21) * lVar16;
    lVar10 = (1L << (bVar4 & 0x3f)) >> 1;
    if (lVar20 < 0) {
      lVar10 = -(lVar10 - lVar20 >> (bVar4 & 0x3f));
    }
    else {
      lVar10 = lVar20 + lVar10 >> (bVar4 & 0x3f);
    }
    lVar20 = 0x1fff;
    if (lVar10 < 0x1fff) {
      lVar20 = lVar10;
    }
    lVar10 = -0x1fff;
    if (-0x1fff < lVar20) {
      lVar10 = lVar20;
    }
    wm_params->wmmat[4] = (int)lVar10;
    lVar16 = (lVar14 * iVar21 + (long)iVar23 * -lVar18) * lVar16;
    lVar20 = (1L << (bVar4 & 0x3f)) >> 1;
    if (lVar16 < 0) {
      lVar16 = -(lVar20 - lVar16 >> (bVar4 & 0x3f));
    }
    else {
      lVar16 = lVar16 + lVar20 >> (bVar4 & 0x3f);
    }
    lVar20 = 0x11fff;
    if (lVar16 < 0x11fff) {
      lVar20 = lVar16;
    }
    lVar16 = 0xe001;
    if (0xe001 < lVar20) {
      lVar16 = lVar20;
    }
    iVar2 = iVar2 + mi_row * 4;
    iVar15 = iVar15 + mi_col * 4;
    iVar21 = ((0x10000 - (int)lVar8) * iVar15 + mvx * 0x2000) - (int)lVar9 * iVar2;
    iVar2 = (0x10000 - (int)lVar16) * iVar2 + (mvy * 0x2000 - (int)lVar10 * iVar15);
    if (0x7ffffe < iVar21) {
      iVar21 = 0x7fffff;
    }
    if (iVar21 < -0x7fffff) {
      iVar21 = -0x800000;
    }
    if (0x7ffffe < iVar2) {
      iVar2 = 0x7fffff;
    }
    if (iVar2 < -0x7fffff) {
      iVar2 = -0x800000;
    }
    wm_params->wmmat[5] = (int)lVar16;
    wm_params->wmmat[0] = iVar21;
    wm_params->wmmat[1] = iVar2;
    uVar5 = 1;
    if (lVar14 * uVar19 != lVar18 * lVar18) {
      uVar5 = av1_get_shear_params(wm_params);
      uVar5 = uVar5 ^ 1;
    }
  }
  return uVar5;
}

Assistant:

static int find_affine_int(int np, const int *pts1, const int *pts2,
                           BLOCK_SIZE bsize, int mvy, int mvx,
                           WarpedMotionParams *wm, int mi_row, int mi_col) {
  int32_t A[2][2] = { { 0, 0 }, { 0, 0 } };
  int32_t Bx[2] = { 0, 0 };
  int32_t By[2] = { 0, 0 };

  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  const int rsuy = bh / 2 - 1;
  const int rsux = bw / 2 - 1;
  const int suy = rsuy * 8;
  const int sux = rsux * 8;
  const int duy = suy + mvy;
  const int dux = sux + mvx;

  // Assume the center pixel of the block has exactly the same motion vector
  // as transmitted for the block. First shift the origin of the source
  // points to the block center, and the origin of the destination points to
  // the block center added to the motion vector transmitted.
  // Let (xi, yi) denote the source points and (xi', yi') denote destination
  // points after origin shfifting, for i = 0, 1, 2, .... n-1.
  // Then if  P = [x0, y0,
  //               x1, y1
  //               x2, y1,
  //                ....
  //              ]
  //          q = [x0', x1', x2', ... ]'
  //          r = [y0', y1', y2', ... ]'
  // the least squares problems that need to be solved are:
  //          [h1, h2]' = inv(P'P)P'q and
  //          [h3, h4]' = inv(P'P)P'r
  // where the affine transformation is given by:
  //          x' = h1.x + h2.y
  //          y' = h3.x + h4.y
  //
  // The loop below computes: A = P'P, Bx = P'q, By = P'r
  // We need to just compute inv(A).Bx and inv(A).By for the solutions.
  // Contribution from neighbor block
  for (int i = 0; i < np; i++) {
    const int dx = pts2[i * 2] - dux;
    const int dy = pts2[i * 2 + 1] - duy;
    const int sx = pts1[i * 2] - sux;
    const int sy = pts1[i * 2 + 1] - suy;
    // (TODO)yunqing: This comparison wouldn't be necessary if the sample
    // selection is done in find_samples(). Also, global offset can be removed
    // while collecting samples.
    if (abs(sx - dx) < LS_MV_MAX && abs(sy - dy) < LS_MV_MAX) {
      A[0][0] += LS_SQUARE(sx);
      A[0][1] += LS_PRODUCT1(sx, sy);
      A[1][1] += LS_SQUARE(sy);
      Bx[0] += LS_PRODUCT2(sx, dx);
      Bx[1] += LS_PRODUCT1(sy, dx);
      By[0] += LS_PRODUCT1(sx, dy);
      By[1] += LS_PRODUCT2(sy, dy);
    }
  }

  // Just for debugging, and can be removed later.
  assert(A[0][0] >= LS_MAT_MIN && A[0][0] <= LS_MAT_MAX);
  assert(A[0][1] >= LS_MAT_MIN && A[0][1] <= LS_MAT_MAX);
  assert(A[1][1] >= LS_MAT_MIN && A[1][1] <= LS_MAT_MAX);
  assert(Bx[0] >= LS_MAT_MIN && Bx[0] <= LS_MAT_MAX);
  assert(Bx[1] >= LS_MAT_MIN && Bx[1] <= LS_MAT_MAX);
  assert(By[0] >= LS_MAT_MIN && By[0] <= LS_MAT_MAX);
  assert(By[1] >= LS_MAT_MIN && By[1] <= LS_MAT_MAX);

  // Compute Determinant of A
  const int64_t Det = (int64_t)A[0][0] * A[1][1] - (int64_t)A[0][1] * A[0][1];
  if (Det == 0) return 1;

  int16_t shift;
  int16_t iDet = resolve_divisor_64(llabs(Det), &shift) * (Det < 0 ? -1 : 1);
  shift -= WARPEDMODEL_PREC_BITS;
  if (shift < 0) {
    iDet <<= (-shift);
    shift = 0;
  }

  int64_t Px[2], Py[2];
  // These divided by the Det, are the least squares solutions
  Px[0] = (int64_t)A[1][1] * Bx[0] - (int64_t)A[0][1] * Bx[1];
  Px[1] = -(int64_t)A[0][1] * Bx[0] + (int64_t)A[0][0] * Bx[1];
  Py[0] = (int64_t)A[1][1] * By[0] - (int64_t)A[0][1] * By[1];
  Py[1] = -(int64_t)A[0][1] * By[0] + (int64_t)A[0][0] * By[1];

  wm->wmmat[2] = get_mult_shift_diag(Px[0], iDet, shift);
  wm->wmmat[3] = get_mult_shift_ndiag(Px[1], iDet, shift);
  wm->wmmat[4] = get_mult_shift_ndiag(Py[0], iDet, shift);
  wm->wmmat[5] = get_mult_shift_diag(Py[1], iDet, shift);

  const int isuy = (mi_row * MI_SIZE + rsuy);
  const int isux = (mi_col * MI_SIZE + rsux);
  // Note: In the vx, vy expressions below, the max value of each of the
  // 2nd and 3rd terms are (2^16 - 1) * (2^13 - 1). That leaves enough room
  // for the first term so that the overall sum in the worst case fits
  // within 32 bits overall.
  const int32_t vx = mvx * (1 << (WARPEDMODEL_PREC_BITS - 3)) -
                     (isux * (wm->wmmat[2] - (1 << WARPEDMODEL_PREC_BITS)) +
                      isuy * wm->wmmat[3]);
  const int32_t vy = mvy * (1 << (WARPEDMODEL_PREC_BITS - 3)) -
                     (isux * wm->wmmat[4] +
                      isuy * (wm->wmmat[5] - (1 << WARPEDMODEL_PREC_BITS)));
  wm->wmmat[0] =
      clamp(vx, -WARPEDMODEL_TRANS_CLAMP, WARPEDMODEL_TRANS_CLAMP - 1);
  wm->wmmat[1] =
      clamp(vy, -WARPEDMODEL_TRANS_CLAMP, WARPEDMODEL_TRANS_CLAMP - 1);
  return 0;
}